

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  printf("Table size = %d. Entries = %d. ",(ulong)(uint)(p->vHTable).nSize,
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  printf("Hits = %d. Misses = %d.\n",(ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss);
  uVar2 = (p->vHTable).nSize;
  if (0 < (int)uVar2) {
    uVar1 = 1000;
    if (uVar2 < 1000) {
      uVar1 = uVar2;
    }
    uVar4 = 0;
    do {
      if ((long)(p->vHTable).nSize <= (long)uVar4) {
LAB_00209bd7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = (p->vHTable).pArray[uVar4];
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          if (((int)uVar2 < 0) || ((p->vHash).nSize <= (int)uVar2)) goto LAB_00209bd7;
          uVar2 = (p->vHash).pArray[uVar2];
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (uVar2 != 0);
        printf("%d ",uVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    int iEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", Vec_IntSize(&p->vHTable), Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, Vec_IntSize(&p->vHTable) );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( iEntry = Vec_IntEntry(&p->vHTable, i); 
              iEntry; 
              iEntry = iEntry? Vec_IntEntry(&p->vHash, iEntry) : 0 )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}